

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::CurrencySpacingEnabledModifier::CurrencySpacingEnabledModifier
          (CurrencySpacingEnabledModifier *this,NumberStringBuilder *prefix,
          NumberStringBuilder *suffix,bool overwrite,bool strong,DecimalFormatSymbols *symbols,
          UErrorCode *status)

{
  UnicodeSet *this_00;
  UnicodeString *this_01;
  UnicodeSet *this_02;
  UnicodeString *this_03;
  UBool UVar1;
  int32_t iVar2;
  UChar32 UVar3;
  ValueOrHeapArray<UNumberFormatFields> *pVVar4;
  UnicodeSet local_e0;
  UnicodeSet prefixUnicodeSet;
  
  ConstantMultiFieldModifier::ConstantMultiFieldModifier
            (&this->super_ConstantMultiFieldModifier,prefix,suffix,overwrite,strong);
  (this->super_ConstantMultiFieldModifier).super_Modifier._vptr_Modifier =
       (_func_int **)&PTR__CurrencySpacingEnabledModifier_0039db78;
  this_00 = &this->fAfterPrefixUnicodeSet;
  UnicodeSet::UnicodeSet(this_00);
  this_01 = &this->fAfterPrefixInsert;
  (this->fAfterPrefixInsert).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003a7268;
  (this->fAfterPrefixInsert).fUnion.fStackFields.fLengthAndFlags = 2;
  this_02 = &this->fBeforeSuffixUnicodeSet;
  UnicodeSet::UnicodeSet(this_02);
  this_03 = &this->fBeforeSuffixInsert;
  (this->fBeforeSuffixInsert).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003a7268;
  (this->fBeforeSuffixInsert).fUnion.fStackFields.fLengthAndFlags = 2;
  iVar2 = NumberStringBuilder::length(prefix);
  if (0 < iVar2) {
    iVar2 = NumberStringBuilder::length(prefix);
    if (prefix->fUsingHeap == false) {
      pVVar4 = &prefix->fFields;
    }
    else {
      pVVar4 = (ValueOrHeapArray<UNumberFormatFields> *)(prefix->fFields).heap.ptr;
    }
    if (*(int *)((long)pVVar4 + ((long)prefix->fZero + (long)iVar2) * 4 + -4) == 7) {
      UVar3 = NumberStringBuilder::getLastCodePoint(prefix);
      getUnicodeSet(&prefixUnicodeSet,symbols,IN_CURRENCY,PREFIX,status);
      UVar1 = UnicodeSet::contains(&prefixUnicodeSet,UVar3);
      if (UVar1 == '\0') {
        UnicodeSet::setToBogus(this_00);
        UnicodeString::setToBogus(this_01);
      }
      else {
        getUnicodeSet(&local_e0,symbols,IN_NUMBER,PREFIX,status);
        UnicodeSet::operator=(this_00,&local_e0);
        UnicodeSet::~UnicodeSet(&local_e0);
        UnicodeSet::freeze(this_00);
        getInsertString((UnicodeString *)&local_e0,symbols,PREFIX,status);
        UnicodeString::moveFrom(this_01,(UnicodeString *)&local_e0);
        UnicodeString::~UnicodeString((UnicodeString *)&local_e0);
      }
      UnicodeSet::~UnicodeSet(&prefixUnicodeSet);
      goto LAB_00253d49;
    }
  }
  UnicodeSet::setToBogus(this_00);
  UnicodeString::setToBogus(this_01);
LAB_00253d49:
  iVar2 = NumberStringBuilder::length(suffix);
  if (0 < iVar2) {
    if (suffix->fUsingHeap == false) {
      pVVar4 = &suffix->fFields;
    }
    else {
      pVVar4 = (ValueOrHeapArray<UNumberFormatFields> *)(suffix->fFields).heap.ptr;
    }
    if (pVVar4->value[suffix->fZero] == UNUM_CURRENCY_FIELD) {
      UVar3 = NumberStringBuilder::getLastCodePoint(suffix);
      getUnicodeSet(&prefixUnicodeSet,symbols,IN_CURRENCY,SUFFIX,status);
      UVar1 = UnicodeSet::contains(&prefixUnicodeSet,UVar3);
      if (UVar1 == '\0') {
        UnicodeSet::setToBogus(this_02);
        UnicodeString::setToBogus(this_03);
      }
      else {
        getUnicodeSet(&local_e0,symbols,IN_NUMBER,SUFFIX,status);
        UnicodeSet::operator=(this_02,&local_e0);
        UnicodeSet::~UnicodeSet(&local_e0);
        UnicodeSet::freeze(this_02);
        getInsertString((UnicodeString *)&local_e0,symbols,SUFFIX,status);
        UnicodeString::moveFrom(this_03,(UnicodeString *)&local_e0);
        UnicodeString::~UnicodeString((UnicodeString *)&local_e0);
      }
      UnicodeSet::~UnicodeSet(&prefixUnicodeSet);
      return;
    }
  }
  UnicodeSet::setToBogus(this_02);
  UnicodeString::setToBogus(this_03);
  return;
}

Assistant:

CurrencySpacingEnabledModifier::CurrencySpacingEnabledModifier(const NumberStringBuilder &prefix,
                                                               const NumberStringBuilder &suffix,
                                                               bool overwrite,
                                                               bool strong,
                                                               const DecimalFormatSymbols &symbols,
                                                               UErrorCode &status)
        : ConstantMultiFieldModifier(prefix, suffix, overwrite, strong) {
    // Check for currency spacing. Do not build the UnicodeSets unless there is
    // a currency code point at a boundary.
    if (prefix.length() > 0 && prefix.fieldAt(prefix.length() - 1) == UNUM_CURRENCY_FIELD) {
        int prefixCp = prefix.getLastCodePoint();
        UnicodeSet prefixUnicodeSet = getUnicodeSet(symbols, IN_CURRENCY, PREFIX, status);
        if (prefixUnicodeSet.contains(prefixCp)) {
            fAfterPrefixUnicodeSet = getUnicodeSet(symbols, IN_NUMBER, PREFIX, status);
            fAfterPrefixUnicodeSet.freeze();
            fAfterPrefixInsert = getInsertString(symbols, PREFIX, status);
        } else {
            fAfterPrefixUnicodeSet.setToBogus();
            fAfterPrefixInsert.setToBogus();
        }
    } else {
        fAfterPrefixUnicodeSet.setToBogus();
        fAfterPrefixInsert.setToBogus();
    }
    if (suffix.length() > 0 && suffix.fieldAt(0) == UNUM_CURRENCY_FIELD) {
        int suffixCp = suffix.getLastCodePoint();
        UnicodeSet suffixUnicodeSet = getUnicodeSet(symbols, IN_CURRENCY, SUFFIX, status);
        if (suffixUnicodeSet.contains(suffixCp)) {
            fBeforeSuffixUnicodeSet = getUnicodeSet(symbols, IN_NUMBER, SUFFIX, status);
            fBeforeSuffixUnicodeSet.freeze();
            fBeforeSuffixInsert = getInsertString(symbols, SUFFIX, status);
        } else {
            fBeforeSuffixUnicodeSet.setToBogus();
            fBeforeSuffixInsert.setToBogus();
        }
    } else {
        fBeforeSuffixUnicodeSet.setToBogus();
        fBeforeSuffixInsert.setToBogus();
    }
}